

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O0

void jpc_mqdec_dump(jpc_mqdec_t *mqdec,FILE *out)

{
  FILE *out_local;
  jpc_mqdec_t *mqdec_local;
  
  fprintf((FILE *)out,"MQDEC A = %08lx, C = %08lx, CT=%08lx, ",mqdec->areg,mqdec->creg,mqdec->ctreg)
  ;
  fprintf((FILE *)out,"CTX = %ld, ",(long)mqdec->curctx - (long)mqdec->ctxs >> 3);
  fprintf((FILE *)out,"IND %ld, MPS %d, QEVAL %lx\n",(long)(*mqdec->curctx + -0xb8f6) >> 5,
          (ulong)((*mqdec->curctx)->mps & 1),(*mqdec->curctx)->qeval);
  return;
}

Assistant:

void jpc_mqdec_dump(const jpc_mqdec_t *mqdec, FILE *out)
{
	fprintf(out, "MQDEC A = %08lx, C = %08lx, CT=%08lx, ",
	  (unsigned long) mqdec->areg, (unsigned long) mqdec->creg,
	  (unsigned long) mqdec->ctreg);
	fprintf(out, "CTX = %" PRIdPTR ", ", mqdec->curctx - mqdec->ctxs);
	fprintf(out, "IND %" PRIdPTR ", MPS %d, QEVAL %"PRIxFAST16"\n", *mqdec->curctx -
	  jpc_mqstates, (*mqdec->curctx)->mps, (*mqdec->curctx)->qeval);
}